

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

shared_ptr<kratos::Var> __thiscall
kratos::Generator::get_auxiliary_var(Generator *this,uint32_t width,bool signed_)

{
  size_type *psVar1;
  unordered_map<unsigned_int,_std::shared_ptr<kratos::Var>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>_>
  *this_00;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  pointer ppVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  undefined4 in_register_00000034;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false,_false>,_bool>
  pVar10;
  shared_ptr<kratos::Var> sVar11;
  Generator *local_40;
  int local_34;
  uint local_30;
  undefined1 local_2a;
  bool local_29;
  uint32_t width_local;
  bool signed__local;
  
  local_40 = (Generator *)CONCAT44(in_register_00000034,width);
  local_30 = (uint)CONCAT71(in_register_00000011,signed_);
  uVar2 = (local_40->auxiliary_vars_)._M_h._M_bucket_count;
  uVar6 = (CONCAT71(in_register_00000011,signed_) & 0xffffffff) % uVar2;
  p_Var8 = (local_40->auxiliary_vars_)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != local_30)) {
    while (p_Var8 = p_Var3, p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var3[1]._M_nxt == local_30)) goto LAB_0016c512;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0016c512:
  this_00 = &local_40->auxiliary_vars_;
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    local_34 = 1;
    (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::Var,std::allocator<kratos::Var>,kratos::Generator*,char_const(&)[1],unsigned_int&,int,bool&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
               (Var **)this,(allocator<kratos::Var> *)&local_2a,&local_40,(char (*) [1])0x23a290,
               &local_30,&local_34,&local_29);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::Var,kratos::Var>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (Var *)(this->super_IRNode)._vptr_IRNode);
    pVar10 = std::
             _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<unsigned_int&,std::shared_ptr<kratos::Var>&>
                       ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)this_00,&local_30,this);
    _Var7._M_pi = pVar10._8_8_;
  }
  else {
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this_00,&local_30);
    (this->super_IRNode)._vptr_IRNode =
         (_func_int **)(pmVar5->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppVar4 = (pointer)(pmVar5->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar4;
    _Var7._M_pi = extraout_RDX;
    if (ppVar4 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(ppVar4->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(ppVar4->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  sVar11.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  sVar11.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar11.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Var> Generator::get_auxiliary_var(uint32_t width, bool signed_) {
    if (auxiliary_vars_.find(width) != auxiliary_vars_.end()) {
        return auxiliary_vars_.at(width);
    }
    auto v = std::make_shared<Var>(this, "", width, 1, signed_);
    auxiliary_vars_.emplace(width, v);
    return v;
}